

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

void ParseDecorate(FScanner *sc)

{
  PSymbolTable *symt;
  byte *pbVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  PClassActor *info;
  PSymbol *pPVar9;
  FPropertyInfo *pFVar10;
  FPropParam *pFVar11;
  FPropParam this;
  FxIntCast *this_00;
  FxConstant *this_01;
  PClassActor *pPVar12;
  FState *pFVar13;
  FxExpression *pFVar14;
  PArray *type;
  long lVar15;
  PFloat **ppPVar16;
  byte *pbVar17;
  SWORD SVar18;
  int iVar19;
  char *text;
  bool bVar20;
  SavedPos SVar21;
  FName typeName;
  undefined4 uStack_194;
  FName parentName;
  undefined4 uStack_18c;
  FName replaceName;
  undefined4 uStack_184;
  TArray<PType_*,_PType_*> rets;
  FName local_160;
  FName local_15c;
  char *local_158;
  FPropertyInfo *local_150;
  AActor *local_148;
  SavedPos pos;
  FScanner newscanner;
  
  local_158 = FString::NullString.Nothing;
  do {
    while( true ) {
      while( true ) {
        SVar21 = FScanner::SavePos(sc);
        pos.SavedScriptPtr = SVar21.SavedScriptPtr;
        pos.SavedScriptLine = SVar21.SavedScriptLine;
        bVar3 = FScanner::GetToken(sc);
        if (!bVar3) {
          return;
        }
        iVar5 = sc->TokenType;
        if (iVar5 != 0x3b) break;
        FScanner::ScriptError(sc,"Unexpected \';\'");
      }
      if (iVar5 == 0x101) break;
      if (iVar5 == 0x127) {
        ParseConstant(sc,&GlobalSymbols,(PClassActor *)0x0);
      }
      else if (iVar5 == 0x142) {
        ParseEnum(sc,&GlobalSymbols,(PClassActor *)0x0);
      }
      else if (iVar5 == 0x171) {
        FScanner::MustGetString(sc);
        iVar5 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum);
        if ((iVar5 == 0) &&
           (iVar5 = DArgs::CheckParm(Args,"-allowdecoratecrossincludes",1), iVar5 == 0)) {
          iVar5 = FWadCollection::CheckNumForFullName(&Wads,sc->String,true,0);
          iVar5 = FWadCollection::GetLumpFile(&Wads,iVar5);
          if (iVar5 != 0) {
            pcVar7 = FWadCollection::GetWadFullName(&Wads,iVar5);
            I_FatalError("File %s is overriding core lump %s.",pcVar7,sc->String);
          }
        }
        FScanner::FScanner(&newscanner);
        FScanner::Open(&newscanner,sc->String);
        ParseDecorate(&newscanner);
        FScanner::~FScanner(&newscanner);
      }
      else {
LAB_005dcffc:
        FScanner::RestorePos(sc,&pos);
        ParseOldDecoration(sc,DEF_Decoration);
      }
    }
    bVar3 = FScanner::Compare(sc,"ACTOR");
    if (bVar3) {
      newscanner.String = local_158;
      newscanner.ScriptPtr = (char *)0x0;
      newscanner.ScriptEndPtr = (char *)0x0;
      newscanner.ScriptName.Chars = (char *)0x0;
      newscanner.ScriptOpen = false;
      newscanner._57_7_ = 0;
      newscanner.Name.Index = 0;
      newscanner.Line = 0;
      newscanner.End = false;
      newscanner.Crossed = false;
      newscanner._42_2_ = 0;
      newscanner.LumpNum = 0;
      newscanner.ScriptBuffer.Chars = (char *)0xffffffffffffffff;
      newscanner.StringBuffer._8_8_ = local_158;
      newscanner.StringBuffer[0x10] = '\0';
      newscanner.StringBuffer[0x11] = '\0';
      newscanner.StringBuffer[0x12] = '\0';
      newscanner.StringBuffer[0x13] = '\0';
      _typeName = _typeName & 0xffffffff00000000;
      FString::NullString.RefCount = FString::NullString.RefCount + 2;
      _parentName = _parentName & 0xffffffff00000000;
      replaceName.Index = 0;
      FScanner::MustGetString(sc);
      pcVar7 = sc->String;
      pcVar8 = strchr(pcVar7,0x3a);
      if (pcVar8 == (char *)0x0) {
        text = (char *)0x0;
      }
      else {
        text = pcVar8 + 1;
        *pcVar8 = '\0';
        pcVar7 = sc->String;
      }
      FName::operator=(&typeName,pcVar7);
      if (text == (char *)0x0) {
        FScanner::MustGetString(sc);
        if (*sc->String == ':') {
          text = sc->String + 1;
          goto LAB_005dbdb1;
        }
LAB_005dbdc7:
        FScanner::UnGet(sc);
        text = (char *)0x0;
      }
      else {
LAB_005dbdb1:
        if (*text == '\0') {
          FScanner::MustGetString(sc);
          text = sc->String;
          if (text == (char *)0x0) goto LAB_005dbdc7;
        }
      }
      FName::operator=(&parentName,text);
      bVar3 = FScanner::CheckString(sc,"replaces");
      if (bVar3) {
        FScanner::MustGetString(sc);
        FName::operator=(&replaceName,sc->String);
        if (replaceName.Index == typeName.Index) {
          FScanner::ScriptMessage
                    (sc,"Cannot replace class %s with itself",
                     FName::NameData.NameArray[replaceName.Index].Text);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
      }
      FScanner::SetCMode(sc,true);
      bVar3 = FScanner::CheckNumber(sc);
      iVar5 = -1;
      if ((bVar3) && (iVar5 = sc->Number, 0x8000 < iVar5 + 1U)) {
        FScanner::ScriptMessage(sc,"DoomEdNum must be in the range [-1,32767]");
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        iVar5 = -1;
      }
      bVar3 = FScanner::CheckString(sc,"native");
      FScriptPosition::FScriptPosition((FScriptPosition *)&rets,sc);
      local_15c.Index = typeName.Index;
      local_160.Index = parentName.Index;
      info = CreateNewActor((FScriptPosition *)&rets,&local_15c,&local_160,bVar3);
      FString::~FString((FString *)&rets);
      SVar18 = (SWORD)iVar5;
      if (iVar5 < 1) {
        SVar18 = -1;
      }
      info->DoomEdNum = SVar18;
      FWadCollection::GetLumpFullPath((FWadCollection *)&rets,0xa07390);
      FString::operator=(&info->SourceLumpName,(FString *)&rets);
      FString::~FString((FString *)&rets);
      rets.Array = (PType **)CONCAT44(rets.Array._4_4_,replaceName.Index);
      SetReplacement(sc,info,(FName *)&rets);
      if (info == (PClassActor *)AActor::RegistrationInfo.MyClass) {
        pPVar12 = (PClassActor *)0x0;
      }
      else {
        pPVar12 = (PClassActor *)(info->super_PClass).ParentClass;
      }
      ResetBaggage((Baggage *)&newscanner,pPVar12);
      newscanner.Float._0_4_ = sc->LumpNum;
      newscanner._8_8_ = info;
      FString::operator=((FString *)&newscanner,FName::NameData.NameArray[typeName.Index].Text);
      FScanner::MustGetToken(sc,0x7b);
      symt = &(info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
              Symbols;
LAB_005dbf98:
      while( true ) {
        while( true ) {
          FScanner::MustGetAnyToken(sc);
          iVar5 = sc->TokenType;
          if ((iVar5 != 0x2b) && (iVar5 != 0x2d)) break;
          FScanner::MustGetString(sc);
          FString::FString((FString *)&rets,sc->String);
          bVar3 = FScanner::CheckString(sc,".");
          if (bVar3) {
            FScanner::MustGetString(sc);
            pcVar7 = sc->String;
          }
          else {
            pcVar7 = (char *)0x0;
          }
          HandleActorFlag(sc,(Baggage *)&newscanner,(char *)rets.Array,pcVar7,iVar5);
          FString::~FString((FString *)&rets);
        }
        if (iVar5 != 0x101) break;
        strlwr(sc->String);
        FString::FString((FString *)&replaceName,sc->String);
        bVar3 = FScanner::CheckString(sc,".");
        if (bVar3) {
          FScanner::MustGetString(sc);
          FString::operator+=((FString *)&replaceName,'.');
          strlwr(sc->String);
          FString::operator+=((FString *)&replaceName,sc->String);
        }
        else {
          FScanner::UnGet(sc);
        }
        pFVar10 = FindProperty((char *)CONCAT44(uStack_184,replaceName.Index));
        if (pFVar10 == (FPropertyInfo *)0x0) {
          iVar5 = MatchString((char *)CONCAT44(uStack_184,replaceName.Index),
                              (char **)ParseActorProperty(FScanner&,Baggage&)::statenames);
          uVar2 = newscanner._8_8_;
          pcVar7 = (char *)CONCAT44(uStack_184,replaceName.Index);
          if (iVar5 == -1) {
            FScanner::ScriptError(sc,"\"%s\" is an unknown actor property\n",pcVar7);
          }
          else {
            bVar3 = FScanner::GetString(sc);
            if (((!bVar3) || (sc->Crossed != false)) || (bVar3 = FScanner::Compare(sc,"0"), bVar3))
            {
LAB_005dcd70:
              pFVar13 = (FState *)0x0;
            }
            else {
              bVar3 = FScanner::Compare(sc,"PARENT");
              if (!bVar3) {
                FScanner::ScriptMessage(sc,"Invalid state assignment");
LAB_005dcd1d:
                FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                goto LAB_005dcd70;
              }
              FScanner::MustGetString(sc);
              pPVar12 = dyn_cast<PClassActor>(*(DObject **)(uVar2 + 0xb0));
              if (pPVar12 == (PClassActor *)0x0) {
                pFVar13 = (FState *)0x0;
              }
              else {
                FName::FName((FName *)&rets,sc->String);
                pFVar13 = PClassActor::FindState(pPVar12,(FName *)&rets);
              }
              bVar3 = FScanner::GetString(sc);
              iVar5 = 0;
              if (bVar3) {
                bVar3 = FScanner::Compare(sc,"+");
                if (bVar3) {
                  FScanner::MustGetNumber(sc);
                  iVar5 = sc->Number;
                }
                else {
                  FScanner::UnGet(sc);
                }
              }
              if (pFVar13 == (FState *)0x0 && iVar5 == 0) goto LAB_005dcd70;
              if (iVar5 != 0 && pFVar13 == (FState *)0x0) {
                FScanner::ScriptMessage
                          (sc,"Attempt to get invalid state from actor %s\n",
                           FName::NameData.NameArray[*(int *)(*(long *)(uVar2 + 0xb0) + 0x88)].Text)
                ;
                goto LAB_005dcd1d;
              }
              pFVar13 = pFVar13 + iVar5;
            }
            FStateDefinitions::SetStateLabel
                      ((FStateDefinitions *)&newscanner.Name,pcVar7,pFVar13,'\x01');
          }
        }
        else {
          bVar3 = PClass::IsAncestorOf(*pFVar10->cls,(PClass *)newscanner._8_8_);
          if (bVar3) {
            local_148 = *(AActor **)(newscanner._8_8_ + 200);
            if ((ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params == '\0') &&
               (iVar5 = __cxa_guard_acquire(&ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                             ::params), iVar5 != 0)) {
              ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params = (int *)0x0;
              uRam0000000000a12f18 = 0;
              __cxa_atexit(TArray<FPropParam,_FPropParam>::~TArray,
                           &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params,
                           &__dso_handle);
              __cxa_guard_release(&ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                   params);
            }
            if ((ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings == '\0') &&
               (iVar5 = __cxa_guard_acquire(&ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                             ::strings), iVar5 != 0)) {
              ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings._0_8_ = 0;
              ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings._8_8_ = 0;
              __cxa_atexit(TArray<FString,_FString>::~TArray,
                           ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings,
                           &__dso_handle);
              __cxa_guard_release(&ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                   strings);
            }
            TArray<FPropParam,_FPropParam>::Clear
                      ((TArray<FPropParam,_FPropParam> *)
                       &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params);
            TArray<FString,_FString>::Clear
                      ((TArray<FString,_FString> *)
                       ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings);
            TArray<FPropParam,_FPropParam>::Reserve
                      ((TArray<FPropParam,_FPropParam> *)
                       &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params,1);
            *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params = 0;
            pbVar17 = (byte *)pFVar10->params;
            bVar4 = *pbVar17;
            local_150 = pFVar10;
            if (bVar4 != 0x30) {
              while (bVar4 != 0) {
                _typeName = 0.0;
                _parentName = 2.12199579047121e-314;
                FScriptPosition::FScriptPosition((FScriptPosition *)&rets,sc);
                FScriptPosition::operator=
                          ((FScriptPosition *)(newscanner.StringBuffer + 8),(FScriptPosition *)&rets
                          );
                FString::~FString((FString *)&rets);
                switch(*pbVar17 & 0xdf) {
                case 0x43:
                  bVar3 = FScanner::CheckNumber(sc);
                  if (bVar3) {
                    iVar5 = sc->Number;
                    if (0xfe < iVar5) {
                      iVar5 = 0xff;
                    }
                    if (iVar5 < 1) {
                      iVar5 = 0;
                    }
                    FScanner::CheckString(sc,",");
                    FScanner::MustGetNumber(sc);
                    iVar19 = sc->Number;
                    if (0xfe < iVar19) {
                      iVar19 = 0xff;
                    }
                    if (iVar19 < 1) {
                      iVar19 = 0;
                    }
                    FScanner::CheckString(sc,",");
                    FScanner::MustGetNumber(sc);
                    uVar6 = sc->Number;
                    if (0xfe < (int)uVar6) {
                      uVar6 = 0xff;
                    }
                    bVar3 = false;
                    if ((int)uVar6 < 1) {
                      uVar6 = 0;
                    }
                    typeName.Index = iVar19 << 8 | iVar5 << 0x10 | uVar6;
                    _parentName = _parentName & 0xffffffff00000000;
                  }
                  else {
                    FScanner::MustGetString(sc);
                    pcVar7 = sc->String;
                    uVar6 = TArray<FString,_FString>::Reserve
                                      ((TArray<FString,_FString> *)
                                       ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                       ::strings,1);
                    pFVar11 = (FPropParam *)
                              FString::operator=((FString *)
                                                 ((ulong)uVar6 * 8 +
                                                 ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                 ::strings._0_8_),pcVar7);
                    _typeName = *pFVar11;
                    parentName.Index = 1;
LAB_005dc89b:
                    bVar3 = false;
                  }
                  goto LAB_005dc95c;
                default:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                                ,0x3c8,
                                "bool ParsePropertyParams(FScanner &, FPropertyInfo *, AActor *, Baggage &)"
                               );
                case 0x46:
                  FScanner::MustGetFloat(sc);
                  _typeName = (FPropParam)sc->Float;
                  break;
                case 0x49:
                  FScanner::MustGetNumber(sc);
                  iVar5 = sc->Number;
                  goto LAB_005dc79a;
                case 0x4c:
                  bVar3 = FScanner::CheckNumber(sc);
                  if (bVar3) {
                    _parentName = (char *)((ulong)(uint)uStack_18c << 0x20);
                    typeName.Index = sc->Number;
                    goto LAB_005dc89b;
                  }
                  parentName.Index = 1;
                  TArray<FPropParam,_FPropParam>::Push
                            ((TArray<FPropParam,_FPropParam> *)
                             &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params
                             ,(FPropParam *)&parentName);
                  *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                       *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1;
                  do {
                    FScanner::MustGetString(sc);
                    pcVar7 = sc->String;
                    uVar6 = TArray<FString,_FString>::Reserve
                                      ((TArray<FString,_FString> *)
                                       ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                       ::strings,1);
                    pFVar11 = (FPropParam *)
                              FString::operator=((FString *)
                                                 ((ulong)uVar6 * 8 +
                                                 ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                 ::strings._0_8_),pcVar7);
                    _typeName = *pFVar11;
                    TArray<FPropParam,_FPropParam>::Push
                              ((TArray<FPropParam,_FPropParam> *)
                               &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                params,(FPropParam *)&typeName);
                    *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                         *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1
                    ;
                    bVar3 = FScanner::CheckString(sc,",");
                  } while (bVar3);
                  pbVar1 = pbVar17 + 2;
                  bVar20 = pbVar17[1] == 0x5f;
                  pbVar17 = pbVar17 + 1;
                  if (bVar20) {
                    pbVar17 = pbVar1;
                  }
                  goto LAB_005dc9a7;
                case 0x4d:
                  iVar5 = ParseFlagExpressionString
                                    (sc,(FParseValue *)ParseMorphStyle(FScanner&)::morphstyles);
                  goto LAB_005dc79a;
                case 0x4e:
                  iVar5 = ParseFlagExpressionString
                                    (sc,(FParseValue *)
                                        ParseThingActivation(FScanner&)::activationstyles);
LAB_005dc79a:
                  typeName.Index = iVar5;
                  break;
                case 0x53:
switchD_005dc5ec_caseD_53:
                  FScanner::MustGetString(sc);
                  pcVar7 = sc->String;
                  uVar6 = TArray<FString,_FString>::Reserve
                                    ((TArray<FString,_FString> *)
                                     ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                     ::strings,1);
                  pFVar11 = (FPropParam *)
                            FString::operator=((FString *)
                                               ((ulong)uVar6 * 8 +
                                               ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                               ::strings._0_8_),pcVar7);
                  _typeName = *pFVar11;
                  break;
                case 0x54:
                  FScanner::MustGetString(sc);
                  strbin1((char *)&rets);
                  uVar6 = TArray<FString,_FString>::Reserve
                                    ((TArray<FString,_FString> *)
                                     ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                     ::strings,1);
                  pFVar11 = (FPropParam *)
                            FString::operator=((FString *)
                                               ((ulong)uVar6 * 8 +
                                               ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                               ::strings._0_8_),(FString *)&rets);
                  _typeName = *pFVar11;
                  FString::~FString((FString *)&rets);
                  break;
                case 0x58:
                  bVar3 = FScanner::CheckString(sc,"(");
                  if (bVar3) {
                    this.s = (char *)operator_new(0x50);
                    this_00 = (FxIntCast *)operator_new(0x40);
                    pFVar14 = ParseExpression(sc,(PClassActor *)newscanner._8_8_,false);
                    FxIntCast::FxIntCast(this_00,pFVar14);
                    FxDamageValue::FxDamageValue
                              ((FxDamageValue *)this.exp,(FxExpression *)this_00,true);
                    FScanner::MustGetStringName(sc,")");
                  }
                  else {
                    FScanner::MustGetNumber(sc);
                    iVar5 = sc->Number;
                    if (iVar5 == 0) {
                      this.d = 0.0;
                    }
                    else {
                      this.s = (char *)operator_new(0x50);
                      this_01 = (FxConstant *)operator_new(0x48);
                      FxConstant::FxConstant
                                (this_01,iVar5,(FScriptPosition *)(newscanner.StringBuffer + 8));
                      FxDamageValue::FxDamageValue
                                ((FxDamageValue *)this.exp,(FxExpression *)this_01,false);
                    }
                  }
                  _typeName = this;
                  TArray<FPropParam,_FPropParam>::Push
                            ((TArray<FPropParam,_FPropParam> *)
                             &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params
                             ,(FPropParam *)&typeName);
                  break;
                case 0x5a:
                  bVar3 = FScanner::CheckFloat(sc);
                  if (!bVar3) goto switchD_005dc5ec_caseD_53;
                  bVar3 = true;
                  FScanner::UnGet(sc);
                  goto LAB_005dc955;
                }
                bVar3 = false;
LAB_005dc955:
                if (parentName.Index != -1) {
LAB_005dc95c:
                  TArray<FPropParam,_FPropParam>::Push
                            ((TArray<FPropParam,_FPropParam> *)
                             &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params
                             ,(FPropParam *)&parentName);
                  *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                       *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1;
                }
                TArray<FPropParam,_FPropParam>::Push
                          ((TArray<FPropParam,_FPropParam> *)
                           &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params,
                           (FPropParam *)&typeName);
                *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                     *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1;
                pbVar1 = pbVar17 + 2;
                bVar20 = pbVar17[1] == 0x5f;
                pbVar17 = pbVar17 + 1;
                if (bVar20) {
                  pbVar17 = pbVar1;
                }
                if (!bVar3) {
LAB_005dc9a7:
                  if (*pbVar17 == 0) break;
                  if ((char)*pbVar17 < 'a') {
                    if (bVar20) {
                      FScanner::CheckString(sc,",");
                    }
                    else {
                      FScanner::MustGetStringName(sc,",");
                    }
                  }
                  else {
                    bVar3 = FScanner::CheckString(sc,",");
                    if ((bool)(~bVar20 & 1) || bVar3) {
                      if (!bVar3) break;
                    }
                    else {
                      bVar3 = FScanner::CheckFloat(sc);
                      if (!bVar3) break;
                      FScanner::UnGet(sc);
                    }
                  }
                }
                bVar4 = *pbVar17;
              }
            }
            (*local_150->Handler)
                      (local_148,(PClassActor *)newscanner._8_8_,(Baggage *)&newscanner,
                       (FPropParam *)
                       ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params);
          }
          else {
            FScanner::ScriptMessage
                      (sc,"\"%s\" requires an actor of type \"%s\"\n",
                       CONCAT44(uStack_184,replaceName.Index));
            FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
          }
        }
        FString::~FString((FString *)&replaceName);
      }
      if (iVar5 == 0x124) {
        _parentName = _parentName & 0xffffffff00000000;
        rets.Array = (PType **)0x0;
        rets.Most = 0;
        rets.Count = 0;
        if ((sc->LumpNum == -1) ||
           (iVar5 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum), 0 < iVar5)) {
          FScanner::ScriptMessage
                    (sc,
                     "Action functions can only be imported by internal class and actor definitions!"
                    );
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        FScanner::MustGetToken(sc,0x153);
        do {
          bVar3 = FScanner::CheckToken(sc,0x132);
          if (bVar3) {
            _typeName = (FxExpression *)TypeBool;
            TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
          }
          else {
            bVar3 = FScanner::CheckToken(sc,0x13a);
            if (bVar3) {
              _typeName = (FxExpression *)TypeSInt32;
              TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
            }
            else {
              bVar3 = FScanner::CheckToken(sc,0x146);
              if (bVar3) {
                _typeName = (FxExpression *)TypeState;
                TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
              }
              else {
                bVar3 = FScanner::CheckToken(sc,0x133);
                if (bVar3) {
                  _typeName = (FxExpression *)TypeFloat64;
                  TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
                }
              }
            }
          }
          bVar3 = FScanner::CheckToken(sc,0x2c);
        } while (bVar3);
        FScanner::MustGetToken(sc,0x101);
        FName::operator=(&parentName,sc->String);
        typeName.Index = parentName.Index;
        ParseFunctionDef(sc,info,&typeName,&rets,6);
LAB_005dcc3c:
        TArray<PType_*,_PType_*>::~TArray(&rets);
        goto LAB_005dbf98;
      }
      if (iVar5 == 0x127) {
        ParseConstant(sc,symt,info);
        goto LAB_005dbf98;
      }
      if (iVar5 == 0x142) {
        ParseEnum(sc,symt,info);
        goto LAB_005dbf98;
      }
      if (iVar5 == 0x153) {
        TArray<PType_*,_PType_*>::TArray(&rets,1);
        if ((sc->LumpNum == -1) ||
           (iVar5 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum), 0 < iVar5)) {
          FScanner::ScriptMessage(sc,"functions can only be declared by native actors!");
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        FScanner::MustGetAnyToken(sc);
        iVar5 = sc->TokenType;
        if (iVar5 == 0x101) {
          _typeName = (FxExpression *)NewPointer((PType *)DObject::RegistrationInfo.MyClass);
          TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
          FScanner::ScriptError(sc,"Object type variables not implemented yet!");
        }
        else if (iVar5 == 0x146) {
          _typeName = (FxExpression *)TypeState;
          TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
        }
        else if (iVar5 == 0x133) {
          _typeName = (FxExpression *)TypeFloat64;
          TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
        }
        else if (iVar5 == 0x13a) {
          _typeName = (FxExpression *)TypeSInt32;
          TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
        }
        else if (iVar5 != 0x13e) {
          if (iVar5 != 0x132) {
            FScanner::ScriptError(sc,"Invalid return type %s",sc->String);
            goto LAB_005dcc3c;
          }
          _typeName = (FxExpression *)TypeBool;
          TArray<PType_*,_PType_*>::Push(&rets,(PType **)&typeName);
        }
        FScanner::MustGetToken(sc,0x101);
        FName::FName(&typeName,sc->String);
        ParseFunctionDef(sc,info,&typeName,&rets,2);
        goto LAB_005dcc3c;
      }
      if (iVar5 == 0x154) {
        if ((info->super_PClass).bRuntimeClass == false) {
          FScanner::ScriptError(sc,"Native classes may not have user variables");
        }
        FScanner::MustGetAnyToken(sc);
        iVar5 = sc->TokenType;
        if ((iVar5 != 0x133) && (iVar5 != 0x13a)) {
          FScanner::ScriptMessage(sc,"User variables must be of type \'int\' or \'float\'");
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
          iVar5 = sc->TokenType;
        }
        ppPVar16 = &TypeFloat64;
        if (iVar5 == 0x13a) {
          ppPVar16 = (PFloat **)&TypeSInt32;
        }
        type = (PArray *)*ppPVar16;
        FScanner::MustGetToken(sc,0x101);
        if (sc->StringLen < 6) {
LAB_005dc183:
          FScanner::ScriptMessage(sc,"User variable names must begin with \"user_\"");
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
          pcVar7 = sc->String;
        }
        else {
          pcVar7 = sc->String;
          iVar5 = strncasecmp("user_",pcVar7,5);
          if (iVar5 != 0) goto LAB_005dc183;
        }
        FName::FName(&typeName,pcVar7);
        parentName.Index = typeName.Index;
        pPVar9 = PSymbolTable::FindSymbol(symt,&parentName,true);
        pcVar7 = "\'%s\' is already defined in \'%s\' or one of its ancestors.";
        if (pPVar9 == (PSymbol *)0x0) {
          bVar3 = FScanner::CheckToken(sc,0x5b);
          if (bVar3) {
            pFVar14 = ParseExpression(sc,info,true);
            if (pFVar14 == (FxExpression *)0x0) {
              FScanner::ScriptMessage(sc,"Error while resolving array size");
LAB_005dcc86:
              FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
              uVar6 = 1;
            }
            else {
              iVar5 = (*pFVar14->_vptr_FxExpression[3])(pFVar14);
              if ((char)iVar5 == '\0') {
                FScanner::ScriptMessage(sc,"Array size must be a constant");
                goto LAB_005dcc86;
              }
              ExpVal::ExpVal((ExpVal *)&rets,(ExpVal *)(pFVar14 + 1));
              uVar6 = ExpVal::GetInt((ExpVal *)&rets);
              ExpVal::~ExpVal((ExpVal *)&rets);
            }
            FScanner::MustGetToken(sc,0x5d);
            if ((int)uVar6 < 1) {
              FScanner::ScriptMessage(sc,"Array size must be positive");
              FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
              uVar6 = 1;
            }
            type = NewArray((PType *)type,uVar6);
          }
          FScanner::MustGetToken(sc,0x3b);
          rets.Array = (PType **)CONCAT44(rets.Array._4_4_,typeName.Index);
          lVar15 = (**(code **)((long)(info->super_PClass).super_PStruct.super_PNamedType.
                                      super_PCompoundType.super_PType.super_DObject._vptr_DObject +
                               0xa8))(info,(FWadCollection *)&rets,type);
          pcVar7 = "\'%s\' is already defined in \'%s\'.";
          if (lVar15 != 0) goto LAB_005dbf98;
        }
        FScanner::ScriptMessage(sc,pcVar7,FName::NameData.NameArray[typeName.Index].Text);
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        goto LAB_005dbf98;
      }
      if (iVar5 == 0x17a) {
        if (newscanner.Number._1_1_ == '\x01') {
          FScanner::ScriptMessage
                    (sc,"\'%s\' contains multiple state declarations",
                     FName::NameData.NameArray[*(int *)(newscanner._8_8_ + 0x88)].Text);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        ParseStates(sc,(PClassActor *)newscanner._8_8_,*(AActor **)(newscanner._8_8_ + 200),
                    (Baggage *)&newscanner);
        newscanner.Number._1_1_ = '\x01';
        goto LAB_005dbf98;
      }
      if (iVar5 != 0x7d) {
        FScanner::ScriptError(sc,"Unexpected \'%s\' in definition of \'%s\'",sc->String);
        goto LAB_005dbf98;
      }
      FScriptPosition::FScriptPosition((FScriptPosition *)&rets,sc);
      FinishActor((FScriptPosition *)&rets,info,(Baggage *)&newscanner);
      FString::~FString((FString *)&rets);
      FScanner::SetCMode(sc,false);
      Baggage::~Baggage((Baggage *)&newscanner);
    }
    else {
      bVar3 = FScanner::Compare(sc,"PICKUP");
      if (bVar3) {
        ParseOldDecoration(sc,DEF_Pickup);
      }
      else {
        bVar3 = FScanner::Compare(sc,"BREAKABLE");
        if (bVar3) {
          ParseOldDecoration(sc,DEF_BreakableDecoration);
        }
        else {
          bVar3 = FScanner::Compare(sc,"PROJECTILE");
          if (bVar3) {
            ParseOldDecoration(sc,DEF_Projectile);
          }
          else {
            bVar3 = FScanner::Compare(sc,"DAMAGETYPE");
            if (!bVar3) goto LAB_005dcffc;
            FScanner::SetCMode(sc,true);
            FScanner::MustGetString(sc);
            FName::FName((FName *)&rets,sc->String);
            newscanner.String = (char *)0x3ff0000000000000;
            newscanner._8_8_ = newscanner._8_8_ & 0xffffffffffff0000;
            FScanner::MustGetToken(sc,0x7b);
            while (FScanner::MustGetAnyToken(sc), sc->TokenType != 0x7d) {
              bVar3 = FScanner::Compare(sc,"FACTOR");
              if (bVar3) {
                FScanner::MustGetFloat(sc);
                newscanner.String = (char *)sc->Float;
                if (((double)newscanner.String == 0.0) && (!NAN((double)newscanner.String))) {
LAB_005dcfc2:
                  newscanner.StringLen._0_1_ = 1;
                }
              }
              else {
                bVar3 = FScanner::Compare(sc,"REPLACEFACTOR");
                if (bVar3) goto LAB_005dcfc2;
                bVar3 = FScanner::Compare(sc,"NOARMOR");
                if (bVar3) {
                  newscanner.StringLen._1_1_ = 1;
                }
                else {
                  FScanner::ScriptError
                            (sc,"Unexpected data (%s) in damagetype definition.",sc->String);
                }
              }
            }
            typeName.Index = rets.Array._0_4_;
            DamageTypeDefinition::Apply((DamageTypeDefinition *)&newscanner,&typeName);
            FScanner::SetCMode(sc,false);
          }
        }
      }
    }
  } while( true );
}

Assistant:

void ParseDecorate (FScanner &sc)
{
	// Get actor class name.
	for(;;)
	{
		FScanner::SavedPos pos = sc.SavePos();
		if (!sc.GetToken ())
		{
			return;
		}
		switch (sc.TokenType)
		{
		case TK_Include:
		{
			sc.MustGetString();
			// This check needs to remain overridable for testing purposes.
			if (Wads.GetLumpFile(sc.LumpNum) == 0 && !Args->CheckParm("-allowdecoratecrossincludes"))
			{
				int includefile = Wads.GetLumpFile(Wads.CheckNumForFullName(sc.String, true));
				if (includefile != 0)
				{
					I_FatalError("File %s is overriding core lump %s.",
						Wads.GetWadFullName(includefile), sc.String);
				}
			}
			FScanner newscanner;
			newscanner.Open(sc.String);
			ParseDecorate(newscanner);
			break;
		}

		case TK_Const:
			ParseConstant (sc, &GlobalSymbols, NULL);
			break;

		case TK_Enum:
			ParseEnum (sc, &GlobalSymbols, NULL);
			break;

		case ';':
			// ';' is the start of a comment in the non-cmode parser which
			// is used to parse parts of the DECORATE lump. If we don't add 
			// a check here the user will only get weird non-informative
			// error messages if a semicolon is found.
			sc.ScriptError("Unexpected ';'");
			break;

		case TK_Identifier:
			// 'ACTOR' cannot be a keyword because it is also needed as a class identifier
			// so let's do a special case for this.
			if (sc.Compare("ACTOR"))
			{
				ParseActor (sc);
				break;
			}
			else if (sc.Compare("PICKUP"))
			{
				ParseOldDecoration (sc, DEF_Pickup);
				break;
			}
			else if (sc.Compare("BREAKABLE"))
			{
				ParseOldDecoration (sc, DEF_BreakableDecoration);
				break;
			}
			else if (sc.Compare("PROJECTILE"))
			{
				ParseOldDecoration (sc, DEF_Projectile);
				break;
			}
			else if (sc.Compare("DAMAGETYPE"))
			{
				ParseDamageDefinition(sc);
				break;
			}
		default:
			sc.RestorePos(pos);
			ParseOldDecoration(sc, DEF_Decoration);
			break;
		}
	}
}